

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-type.cpp
# Opt level: O0

BasicHeapType __thiscall wasm::HeapType::getUnsharedBottom(HeapType *this)

{
  bool bVar1;
  BasicHeapType BVar2;
  HeapTypeInfo *pHVar3;
  HeapTypeInfo *info;
  HeapType *this_local;
  
  bVar1 = isBasic(this);
  if (bVar1) {
    BVar2 = getBasic(this,Unshared);
    switch(BVar2) {
    case ext:
      this_local._4_4_ = noext;
      break;
    default:
      goto LAB_026754fa;
    case func:
      this_local._4_4_ = nofunc;
      break;
    case cont:
      this_local._4_4_ = nocont;
      break;
    case any:
    case eq:
    case i31:
    case struct_:
    case array:
    case none:
      this_local._4_4_ = none;
      break;
    case exn:
      this_local._4_4_ = noexn;
      break;
    case string:
    case noext:
      this_local._4_4_ = noext;
      break;
    case nofunc:
      this_local._4_4_ = nofunc;
      break;
    case nocont:
      this_local._4_4_ = nocont;
      break;
    case noexn:
      this_local._4_4_ = noexn;
    }
  }
  else {
LAB_026754fa:
    pHVar3 = anon_unknown_0::getHeapTypeInfo((HeapType)this->id);
    switch(pHVar3->kind) {
    case Basic:
    default:
      handle_unreachable("unexpected kind",
                         "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm/wasm-type.cpp"
                         ,0x457);
    case Func:
      this_local._4_4_ = nofunc;
      break;
    case Struct:
    case Array:
      this_local._4_4_ = none;
      break;
    case Cont:
      this_local._4_4_ = nocont;
    }
  }
  return this_local._4_4_;
}

Assistant:

HeapType::BasicHeapType HeapType::getUnsharedBottom() const {
  if (isBasic()) {
    switch (getBasic(Unshared)) {
      case ext:
        return noext;
      case func:
        return nofunc;
      case cont:
        return nocont;
      case exn:
        return noexn;
      case any:
      case eq:
      case i31:
      case struct_:
      case array:
      case none:
        return none;
      case string:
      case noext:
        return noext;
      case nofunc:
        return nofunc;
      case nocont:
        return nocont;
      case noexn:
        return noexn;
    }
  }
  auto* info = getHeapTypeInfo(*this);
  switch (info->kind) {
    case HeapTypeKind::Func:
      return nofunc;
    case HeapTypeKind::Cont:
      return nocont;
    case HeapTypeKind::Struct:
    case HeapTypeKind::Array:
      return none;
    case HeapTypeKind::Basic:
      break;
  }
  WASM_UNREACHABLE("unexpected kind");
}